

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O3

bool __thiscall btGenericPoolAllocator::freeMemory(btGenericPoolAllocator *this,void *pointer)

{
  btGenericMemoryPool *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->m_pool_count != 0) {
    uVar3 = 0;
    do {
      pbVar1 = this->m_pools[uVar3];
      if (*(void **)pbVar1 <= pointer) {
        uVar2 = (long)pointer - (long)*(void **)pbVar1;
        if (uVar2 < *(ulong *)(pbVar1 + 0x30) * *(ulong *)(pbVar1 + 0x28)) {
          *(ulong *)(*(ulong *)(pbVar1 + 8) + *(ulong *)(pbVar1 + 0x20) * 8) =
               uVar2 / *(ulong *)(pbVar1 + 0x28);
          *(ulong *)(pbVar1 + 0x20) = *(ulong *)(pbVar1 + 0x20) + 1;
          return true;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_pool_count);
  }
  btAlignedFreeInternal(pointer);
  return true;
}

Assistant:

bool btGenericPoolAllocator::freeMemory(void * pointer)
{
	bool result = false;

	size_t i = 0;
	while(i<m_pool_count && result == false)
	{
		result = m_pools[i]->freeMemory(pointer);
		++i;
	}

	if(result) return true;

	return failback_free(pointer);
}